

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::OutOfRangeException::OutOfRangeException<signed_char,signed_char>
          (OutOfRangeException *this,string *msg,char params,char params_1)

{
  undefined7 in_register_00000011;
  char in_R8B;
  string local_30;
  
  Exception::ConstructMessage<signed_char,signed_char>
            (&local_30,(Exception *)msg,(string *)CONCAT71(in_register_00000011,params),params_1,
             in_R8B);
  OutOfRangeException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit OutOfRangeException(const string &msg, ARGS... params)
	    : OutOfRangeException(ConstructMessage(msg, params...)) {
	}